

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O0

list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *
ZXing::Aztec::SimplifyStates
          (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *states)

{
  bool bVar1;
  undefined8 in_RSI;
  const_iterator in_RDI;
  EncodingState *oldState;
  iterator iterator;
  bool add;
  EncodingState *newState;
  const_iterator __end2;
  const_iterator __begin2;
  list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *__range2;
  list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *result;
  list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
  *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  EncodingState *state;
  _List_const_iterator<ZXing::Aztec::EncodingState> local_78;
  _List_node_base *local_70;
  reference local_58;
  _Self local_50;
  _Self local_48;
  byte local_39;
  reference local_38;
  _Self local_30;
  _Self local_28;
  undefined8 local_20;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  state = (EncodingState *)in_RDI._M_node;
  local_10 = in_RSI;
  std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
  list((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *)0x2650b1);
  local_20 = local_10;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
       ::begin(in_stack_ffffffffffffff68);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
       ::end(in_stack_ffffffffffffff68);
  do {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *)
             state;
    }
    local_38 = std::_List_const_iterator<ZXing::Aztec::EncodingState>::operator*
                         ((_List_const_iterator<ZXing::Aztec::EncodingState> *)
                          CONCAT17(in_stack_ffffffffffffff77,
                                   CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
    local_39 = 1;
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::begin
                   (in_stack_ffffffffffffff68);
    while( true ) {
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::end
                     (in_stack_ffffffffffffff68);
      bVar1 = std::operator!=(&local_48,&local_50);
      if (!bVar1) break;
      local_58 = std::_List_iterator<ZXing::Aztec::EncodingState>::operator*
                           ((_List_iterator<ZXing::Aztec::EncodingState> *)0x265148);
      in_stack_ffffffffffffff77 = IsBetterThanOrEqualTo(state,(EncodingState *)in_RDI._M_node);
      if ((bool)in_stack_ffffffffffffff77) {
        local_39 = 0;
        break;
      }
      in_stack_ffffffffffffff76 = IsBetterThanOrEqualTo(state,(EncodingState *)in_RDI._M_node);
      if ((bool)in_stack_ffffffffffffff76) {
        std::_List_const_iterator<ZXing::Aztec::EncodingState>::_List_const_iterator
                  (&local_78,&local_48);
        local_70 = (_List_node_base *)
                   std::__cxx11::
                   list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
                   erase((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                          *)CONCAT17(in_stack_ffffffffffffff77,
                                     CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                         in_RDI);
        local_48._M_node = local_70;
      }
      else {
        std::_List_iterator<ZXing::Aztec::EncodingState>::operator++(&local_48);
      }
    }
    if ((local_39 & 1) != 0) {
      std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
      ::push_back((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *
                  )state,(value_type *)in_RDI._M_node);
    }
    std::_List_const_iterator<ZXing::Aztec::EncodingState>::operator++(&local_28);
  } while( true );
}

Assistant:

static std::list<EncodingState> SimplifyStates(const std::list<EncodingState>& states)
{
	std::list<EncodingState> result;
	for (auto& newState : states) {
		bool add = true;
		for (auto iterator = result.begin(); iterator != result.end();) {
			auto& oldState = *iterator;
			if (IsBetterThanOrEqualTo(oldState, newState)) {
				add = false;
				break;
			}
			if (IsBetterThanOrEqualTo(newState, oldState)) {
				iterator = result.erase(iterator);
			}
			else {
				++iterator;
			}
		}
		if (add) {
			result.push_back(newState);
		}
	}
	return result;
}